

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_nextInputSizeHint_MTorST(ZSTD_CCtx *cctx)

{
  size_t sVar1;
  ZSTD_CCtx *cctx_local;
  
  sVar1 = ZSTD_nextInputSizeHint(cctx);
  return sVar1;
}

Assistant:

static size_t ZSTD_nextInputSizeHint_MTorST(const ZSTD_CCtx* cctx)
{
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers >= 1) {
        assert(cctx->mtctx != NULL);
        return ZSTDMT_nextInputSizeHint(cctx->mtctx);
    }
#endif
    return ZSTD_nextInputSizeHint(cctx);

}